

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O2

FontSpec * read_setting_fontspec(settings_r *handle,char *name)

{
  char *pcVar1;
  char *pcVar2;
  FontSpec *pFVar3;
  
  pcVar1 = dupcat_fn(name,"Name",0);
  pcVar2 = read_setting_s(handle,pcVar1);
  if (pcVar2 == (char *)0x0) {
    safefree(pcVar1);
    pcVar1 = read_setting_s(handle,name);
    if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
      safefree(pcVar1);
      pFVar3 = (FontSpec *)0x0;
    }
    else {
      pcVar2 = dupcat_fn("server:",pcVar1,0);
      pFVar3 = fontspec_new(pcVar2);
      safefree(pcVar2);
      safefree(pcVar1);
    }
  }
  else {
    pFVar3 = fontspec_new(pcVar2);
    safefree(pcVar1);
    safefree(pcVar2);
  }
  return pFVar3;
}

Assistant:

FontSpec *read_setting_fontspec(settings_r *handle, const char *name)
{
    /*
     * In GTK1-only PuTTY, we used to store font names simply as a
     * valid X font description string (logical or alias), under a
     * bare key such as "Font".
     *
     * In GTK2 PuTTY, we have a prefix system where "client:"
     * indicates a Pango font and "server:" an X one; existing
     * configuration needs to be reinterpreted as having the
     * "server:" prefix, so we change the storage key from the
     * provided name string (e.g. "Font") to a suffixed one
     * ("FontName").
     */
    char *suffname = dupcat(name, "Name");
    char *tmp;

    if ((tmp = read_setting_s(handle, suffname)) != NULL) {
        FontSpec *fs = fontspec_new(tmp);
        sfree(suffname);
        sfree(tmp);
        return fs;                     /* got new-style name */
    }
    sfree(suffname);

    /* Fall back to old-style name. */
    tmp = read_setting_s(handle, name);
    if (tmp && *tmp) {
        char *tmp2 = dupcat("server:", tmp);
        FontSpec *fs = fontspec_new(tmp2);
        sfree(tmp2);
        sfree(tmp);
        return fs;
    } else {
        sfree(tmp);
        return NULL;
    }
}